

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations2Points1Line<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P2,Matrix<double,_4,_1,_0,_4,_1> *P1_B,
            Matrix<double,_4,_1,_0,_4,_1> *P2_B)

{
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *this_00;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *this_01;
  Scalar *pSVar1;
  RealScalar RVar2;
  RealScalar RVar3;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_8f8;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_8e8;
  undefined1 local_8d8 [8];
  Matrix<double,_4,_4,_0,_4,_4> TP_B;
  undefined1 local_848 [8];
  Matrix<double,_4,_4,_0,_4,_4> TP;
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_7b8 [56];
  non_const_type local_780;
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_778 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_740 [24];
  non_const_type local_728;
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_720 [56];
  non_const_type local_6e8;
  PlainObject local_6e0;
  PlainObject local_6c8;
  type local_6b0;
  type local_698;
  Type local_680;
  PlainObject local_648;
  Type local_618;
  non_const_type local_5e0;
  Type local_5d8;
  type local_5a0;
  non_const_type local_588;
  Type local_580;
  non_const_type local_548;
  PlainObject local_540;
  PlainObject local_528;
  type local_510;
  type local_4f8;
  Type local_4e0;
  PlainObject local_4a8;
  undefined1 local_470 [8];
  Matrix<double,_3,_1,_0,_3,_1> t2;
  Matrix<double,_3,_1,_0,_3,_1> t1;
  Matrix<double,_3,_1,_0,_3,_1> v1_;
  Matrix<double,_3,_1,_0,_3,_1> v1;
  Matrix<double,_3,_1,_0,_3,_1> v3;
  Matrix<double,_4,_4,_0,_4,_4> transV_B;
  Matrix<double,_4,_4,_0,_4,_4> transV;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> local_2e8;
  undefined1 local_2d8 [8];
  Matrix<double,_4,_1,_0,_4,_1> P2_B1;
  Matrix<double,_4,_1,_0,_4,_1> P2_1;
  Type local_260;
  NegativeReturnType local_228;
  Type local_1e8;
  Type local_1b0;
  NegativeReturnType local_178;
  undefined1 local_138 [8];
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  Matrix<double,_4,_1,_0,_4,_1> *P2_B_local;
  Matrix<double,_4,_1,_0,_4,_1> *P1_B_local;
  Matrix<double,_4,_1,_0,_4,_1> *P2_local;
  Matrix<double,_4,_1,_0,_4,_1> *P1_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf));
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_138);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf),4,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1b0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            (&local_178,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_1b0);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_1e8,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf),3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_1e8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_178);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_138,4,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_260,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P1_B,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            (&local_228,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_260);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)(P2_1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array + 3),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_138,3,1)
  ;
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
             (P2_1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3),
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_228);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<double,_4,_1,_0,_4,_1> *)
             (P2_B1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3));
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_2d8);
  local_2e8 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                         (transU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xf),
                         (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P2);
  Eigen::Matrix<double,4,1,0,4,1>::operator=
            ((Matrix<double,4,1,0,4,1> *)
             (P2_B1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3),
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
              *)&local_2e8);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_138,
                  (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P2_B);
  Eigen::Matrix<double,4,1,0,4,1>::operator=
            ((Matrix<double,4,1,0,4,1> *)local_2d8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
              *)(transV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array + 0xf));
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf));
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             (v3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf),4,4);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
             (v3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),4,4);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_470);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),0);
  *pSVar1 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_470);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_470,1);
  *pSVar1 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_4e0,
             (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             (P2_B1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3),3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            (&local_4a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_4e0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(DenseBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *)&local_4a8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_4f8,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),&local_4f8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_510,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_470,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),&local_510);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2));
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2));
  if (RVar2 < RVar3) {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_540,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),&local_540);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_528,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),&local_528);
  }
  local_548 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                          .m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_580,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf),1,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_580,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_548);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_5a0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                   .array + 2));
  local_588 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_5a0);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            (&local_5d8,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf),1,0,1,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_5d8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_588);
  local_5e0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            (&local_618,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array + 0xf),2,0,1,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_618,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_5e0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_680,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2d8,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            (&local_648,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_680);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(DenseBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *)&local_648);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_698,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),&local_698);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_6b0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_470,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),&local_6b0);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2));
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2));
  if (RVar2 < RVar3) {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_6e0,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),&local_6e0);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_6c8,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),&local_6c8);
  }
  this = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         (v1_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
         2);
  local_6e8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(this);
  this_00 = (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
            (v3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            + 2);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)local_720,this_00,1,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            (local_720,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_6e8);
  this_01 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
            (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            + 2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)local_740,this_01,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  local_728 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(local_740);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            ((Type *)local_778,this_00,1,0,1,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            (local_778,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_728);
  local_780 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_01);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            ((Type *)local_7b8,this_00,2,0,1,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            (local_7b8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_780);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_848);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_8d8);
  local_8e8 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                         (transV_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xf),
                         (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                         (transU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xf));
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,4,4,0,4,4> *)local_848,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)&local_8e8);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_848);
  local_8f8 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                         (v3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                         (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_138);
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,4,4,0,4,4> *)local_8d8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)&local_8f8);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_8d8);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations2Points1Line(Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P2, Matrix<floatPrec, 4,1> P1_B, Matrix<floatPrec, 4,1> P2_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> P2_1, P2_B1;
	P2_1 = transU * P2;
	P2_B1 = transU_B * P2_B;

	// align Z axis to the direction of P1 -> P2
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = P2_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = P2_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}